

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O3

void Abc_NtkMiterAddOne(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkMiter)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  char *__assertion;
  long lVar6;
  
  iVar3 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0xee,"void Abc_NtkMiterAddOne(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)pVVar5->pArray[lVar6];
      if (puVar1 != (undefined8 *)0x0) {
        if (((ulong)puVar1 & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002d78d4:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (*(int *)*puVar1 != 3) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_002d78d4;
        }
        if (*(int *)((long)puVar1 + 0x1c) == 2) {
          lVar2 = *(long *)(*(long *)((int *)*puVar1 + 8) + 8);
          pAVar4 = Abc_AigAnd((Abc_Aig_t *)pNtkMiter->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)puVar1 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar2 + (long)*(int *)puVar1[4] * 8) + 0x40)),
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)puVar1 + 0x14) >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar2 + (long)((int *)puVar1[4])[1] * 8) + 0x40))
                             );
          puVar1[8] = pAVar4;
          pVVar5 = pNtk->vObjs;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Abc_NtkMiterAddOne( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkMiter )
{
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    Abc_AigForEachAnd( pNtk, pNode, i )
        pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
}